

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O1

int32_t GetTransactionWeight(CTransaction *tx)

{
  int iVar1;
  long in_FS_OFFSET;
  SizeComputer local_48;
  ParamsStream<SizeComputer_&,_TransactionSerParams> local_40;
  long local_30;
  
  local_40.m_substream = &local_48;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.nSize = 0;
  local_40.m_params = &TX_NO_WITNESS;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (tx,&local_40,&TX_NO_WITNESS);
  iVar1 = (int)local_48.nSize * 3;
  local_48.nSize = 0;
  local_40.m_params = &TX_WITH_WITNESS;
  local_40.m_substream = &local_48;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (tx,&local_40,&TX_WITH_WITNESS);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar1 + (int)local_48.nSize;
  }
  __stack_chk_fail();
}

Assistant:

static inline int32_t GetTransactionWeight(const CTransaction& tx)
{
    return ::GetSerializeSize(TX_NO_WITNESS(tx)) * (WITNESS_SCALE_FACTOR - 1) + ::GetSerializeSize(TX_WITH_WITNESS(tx));
}